

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenerator.cxx
# Opt level: O1

void cmQtAutoGenerator::ReadOnlyProcessT::UVExit
               (uv_process_t *handle,int64_t exitStatus,int termSignal)

{
  ReadOnlyProcessT *this;
  ProcessResultT *pPVar1;
  
  this = (ReadOnlyProcessT *)handle->data;
  if ((this->IsStarted_ == true) && (this->IsFinished_ == false)) {
    pPVar1 = (this->Setup_).Result;
    pPVar1->ExitStatus = exitStatus;
    pPVar1->TermSignal = termSignal;
    ::cm::uv_handle_ptr_base_<uv_process_s>::reset
              ((uv_handle_ptr_base_<uv_process_s> *)&this->UVProcess_);
    UVTryFinish(this);
    return;
  }
  return;
}

Assistant:

void cmQtAutoGenerator::ReadOnlyProcessT::UVExit(uv_process_t* handle,
                                                 int64_t exitStatus,
                                                 int termSignal)
{
  auto& proc = *reinterpret_cast<ReadOnlyProcessT*>(handle->data);
  if (proc.IsStarted() && !proc.IsFinished()) {
    // Set error message on demand
    proc.Result()->ExitStatus = exitStatus;
    proc.Result()->TermSignal = termSignal;
    if (!proc.Result()->error()) {
      if (termSignal != 0) {
        proc.Result()->ErrorMessage = "Process was terminated by signal ";
        proc.Result()->ErrorMessage +=
          std::to_string(proc.Result()->TermSignal);
      } else if (exitStatus != 0) {
        proc.Result()->ErrorMessage = "Process failed with return value ";
        proc.Result()->ErrorMessage +=
          std::to_string(proc.Result()->ExitStatus);
      }
    }

    // Reset process handle and try to finish
    proc.UVProcess_.reset();
    proc.UVTryFinish();
  }
}